

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O3

double GetHeaderInformation(char *filename,char *parameter)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  int answer;
  char data_check [5];
  int local_30;
  undefined4 uStack_2c;
  char local_25 [4];
  undefined1 local_21;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File cannot be opened.");
  }
  else {
    local_21 = 0;
    iVar2 = 0xd;
    do {
      fread(local_25,1,4,__stream);
      iVar1 = strcmp(local_25,parameter);
      if (iVar1 == 0) {
        iVar2 = strcmp(parameter,"FP  ");
        if (iVar2 != 0) {
          fread(&local_30,4,1,__stream);
          fclose(__stream);
          return (double)local_30;
        }
        fread(&local_30,8,1,__stream);
        fclose(__stream);
        return (double)CONCAT44(uStack_2c,local_30);
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return 0.0;
}

Assistant:

double GetHeaderInformation(const char *filename, const char *parameter) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  char data_check[5];
  data_check[4] = '\0';
  for (int i = 0; i < 13; ++i) {
    fread(data_check, 1, 4, fp);
    if (0 != strcmp(data_check, parameter)) continue;
    if (0 == strcmp(parameter, "FP  ")) {
      double answer;
      fread(&answer, 8, 1, fp);
      fclose(fp);
      return answer;
    } else {
      int answer;
      fread(&answer, 4, 1, fp);
      fclose(fp);
      return static_cast<double>(answer);
    }
  }
  return 0;
}